

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict left_op(c2m_ctx_t c2m_ctx,int no_err_p,int token,int token2,nonterm_func_t f)

{
  int iVar1;
  node_t_conflict op;
  bool bVar2;
  undefined1 local_58 [8];
  pos_t pos;
  node_t_conflict n;
  node_t_conflict r;
  nonterm_func_t p_Stack_30;
  node_code_t code;
  nonterm_func_t f_local;
  int local_20;
  int token2_local;
  int token_local;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  p_Stack_30 = f;
  f_local._4_4_ = token2;
  local_20 = token;
  token2_local = no_err_p;
  _token_local = c2m_ctx;
  n = (*f)(c2m_ctx,no_err_p);
  c2m_ctx_local = (c2m_ctx_t)n;
  if (n != &err_struct) {
    while( true ) {
      iVar1 = match(_token_local,local_20,(pos_t *)local_58,(node_code_t *)((long)&r + 4),
                    (node_t_conflict *)0x0);
      bVar2 = true;
      if ((iVar1 == 0) && (bVar2 = false, -1 < f_local._4_4_)) {
        iVar1 = match(_token_local,f_local._4_4_,(pos_t *)local_58,(node_code_t *)((long)&r + 4),
                      (node_t_conflict *)0x0);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) {
        return n;
      }
      pos._8_8_ = new_pos_node1(_token_local,r._4_4_,_local_58,n);
      op = (*p_Stack_30)(_token_local,token2_local);
      if (op == &err_struct) break;
      op_append(_token_local,(node_t_conflict)pos._8_8_,op);
      n = (node_t_conflict)pos._8_8_;
    }
    c2m_ctx_local = (c2m_ctx_t)&err_struct;
  }
  return (node_t_conflict)c2m_ctx_local;
}

Assistant:

static node_t left_op (c2m_ctx_t c2m_ctx, int no_err_p, int token, int token2, nonterm_func_t f) {
  node_code_t code;
  node_t r, n;
  pos_t pos;

  P (f);
  while (MC (token, pos, code) || (token2 >= 0 && MC (token2, pos, code))) {
    n = new_pos_node1 (c2m_ctx, code, pos, r);
    P (f);
    op_append (c2m_ctx, n, r);
    r = n;
  }
  return r;
}